

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etw.cpp
# Opt level: O0

void writeEtw(QFile *file,Provider *provider)

{
  Provider *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString fileName;
  QTextStream stream;
  QTextStream *this;
  QIODevice *in_stack_ffffffffffffff88;
  QString *path;
  QTextStream *in_stack_ffffffffffffff90;
  QTextStream *stream_00;
  _Head_base<0UL,_QTextStreamPrivate_*,_false> in_stack_ffffffffffffffb8;
  QString local_30;
  QTextStream *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QTextStream *)0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QTextStream::QTextStream(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_30.d.ptr._0_4_ = 0xaaaaaaaa;
  local_30.d.ptr._4_4_ = 0xaaaaaaaa;
  local_30.d.size._0_4_ = 0xaaaaaaaa;
  local_30.d.size._4_4_ = 0xaaaaaaaa;
  stream_00 = (QTextStream *)&stack0xffffffffffffffb8;
  local_18 = this;
  (*(code *)(in_RDI->d).d[9].super_QArrayData.alloc)();
  path = &local_30;
  QFileInfo::QFileInfo((QFileInfo *)stream_00,path);
  QFileInfo::fileName((QFileInfo *)&local_30.d.ptr);
  QFileInfo::~QFileInfo((QFileInfo *)0x104ef1);
  QString::~QString((QString *)0x104efb);
  writePrologue((QTextStream *)in_stack_ffffffffffffffb8._M_head_impl,in_RDI,in_RSI);
  writeTracepoints((QTextStream *)in_RDI,in_RSI);
  writeEpilogue(stream_00,path);
  QString::~QString((QString *)0x104f37);
  QTextStream::~QTextStream(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void writeEtw(QFile &file, const Provider &provider)
{
    QTextStream stream(&file);

    const QString fileName = QFileInfo(file.fileName()).fileName();

    writePrologue(stream, fileName, provider);
    writeTracepoints(stream, provider);
    writeEpilogue(stream, fileName);
}